

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::DenseSupportVectors::MergePartialFromCodedStream
          (DenseSupportVectors *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int byte_limit;
  Type *this_00;
  pair<int,_int> pVar6;
  ulong uVar7;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013d346;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013d346:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    uVar5 = (uint32)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\n' || (uVar5 & 0xfffffff8) != 8)) {
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::DenseVector>::TypeHandler>
                          (&(this->vectors_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar6 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar6 < 0) {
        return false;
      }
      bVar4 = DenseVector::MergePartialFromCodedStream(this_00,input);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar6.first);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool DenseSupportVectors::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DenseSupportVectors)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.DenseVector vectors = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_vectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DenseSupportVectors)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DenseSupportVectors)
  return false;
#undef DO_
}